

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scroll_widgets.cpp
# Opt level: O0

void save_pos_for_undo_proc(Am_Object *command_obj)

{
  bool bVar1;
  Am_Value *in_value;
  undefined1 local_68 [8];
  Am_Value value;
  Am_Object obj;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object scroll_command;
  Am_Object local_20;
  Am_Object scrollbar;
  Am_Object inter;
  Am_Object *command_obj_local;
  
  Am_Object::Get_Owner(&scrollbar,(Am_Slot_Flags)command_obj);
  Am_Object::Get_Owner(&local_20,(Am_Slot_Flags)&scrollbar);
  Am_Object::Get_Object(&local_38,(Am_Slot_Key)&local_20,0xc5);
  Am_Object::Am_Object(&local_40,command_obj);
  Am_Object::Am_Object(&local_48,&local_38);
  Am_Object::Am_Object(&obj,&local_20);
  set_up_for_undo(&local_40,&local_48,&obj);
  Am_Object::~Am_Object(&obj);
  Am_Object::~Am_Object(&local_48);
  Am_Object::~Am_Object(&local_40);
  Am_Object::Am_Object((Am_Object *)&value.value);
  Am_Value::Am_Value((Am_Value *)local_68);
  Am_Object::operator=((Am_Object *)&value.value,&local_38);
  while( true ) {
    in_value = Am_Object::Peek((Am_Object *)&value.value,0x154,0);
    Am_Value::operator=((Am_Value *)local_68,in_value);
    bVar1 = Am_Value::Valid((Am_Value *)local_68);
    if (!bVar1) break;
    if (local_68._0_2_ != 0xa001) goto LAB_00330966;
    Am_Object::operator=((Am_Object *)&value.value,(Am_Value *)local_68);
  }
  Am_Object::Set((Am_Object *)&value.value,0x154,-2,0);
LAB_00330966:
  Am_Value::~Am_Value((Am_Value *)local_68);
  Am_Object::~Am_Object((Am_Object *)&value.value);
  Am_Object::~Am_Object(&local_38);
  Am_Object::~Am_Object(&local_20);
  Am_Object::~Am_Object(&scrollbar);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, save_pos_for_undo,
                 (Am_Object command_obj))
{
  Am_Object inter = command_obj.Get_Owner();
  Am_Object scrollbar = inter.Get_Owner();
  Am_Object scroll_command = scrollbar.Get_Object(Am_COMMAND);
  set_up_for_undo(command_obj, scroll_command, scrollbar);
  //find the top-level parent and mark it as not queued until the
  //final do action
  Am_Object obj;
  Am_Value value;
  obj = scroll_command;
  while (true) {
    value = obj.Peek(Am_IMPLEMENTATION_PARENT);
    if (value.Valid()) {
      if (value.type != Am_OBJECT)
        break; //already marked as not queued
    } else {   // not valid
      obj.Set(Am_IMPLEMENTATION_PARENT, Am_MARKER_FOR_SCROLL_INC);
      break;
    }
    obj = value;
  }
}